

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# array.h
# Opt level: O1

CappedArray<char,_3UL> kj::hex(uchar i)

{
  char *pcVar1;
  byte bVar2;
  ulong uVar3;
  char *pcVar4;
  byte *pbVar5;
  undefined7 in_register_00000039;
  ulong uVar6;
  long lVar7;
  CappedArray<char,_3UL> CVar8;
  uint8_t reverse [2];
  CappedArray<char,_3UL> result;
  
  uVar6 = CONCAT71(in_register_00000039,i);
  result.currentSize = 3;
  reverse[0] = '\0';
  reverse[1] = '\0';
  if ((int)uVar6 == 0) {
    pbVar5 = reverse + 1;
    reverse[0] = '\0';
    reverse[1] = '\0';
  }
  else {
    pbVar5 = reverse;
    uVar3 = uVar6 & 0xffffffff;
    do {
      bVar2 = (byte)uVar6;
      *pbVar5 = bVar2 & 0xf;
      pbVar5 = pbVar5 + 1;
      uVar3 = uVar3 >> 4 & 0xf;
      uVar6 = uVar3;
    } while (0xf < bVar2);
  }
  pcVar1 = result.content;
  pcVar4 = pcVar1;
  if (reverse < pbVar5) {
    lVar7 = 0;
    do {
      *pcVar4 = "0123456789abcdef"[pbVar5[lVar7 + -1]];
      pcVar4 = pcVar4 + 1;
      lVar7 = lVar7 + -1;
    } while ((long)reverse - (long)pbVar5 != lVar7);
  }
  CVar8.currentSize = (long)pcVar4 - (long)pcVar1;
  CVar8._8_4_ = result._8_4_ & 0xffffff;
  CVar8._12_4_ = 0;
  return CVar8;
}

Assistant:

CappedArray(): currentSize(fixedSize) {}